

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::compiler::Compiler::Node> * __thiscall
kj::Own<capnp::compiler::Compiler::Node>::operator=
          (Own<capnp::compiler::Compiler::Node> *this,Own<capnp::compiler::Compiler::Node> *other)

{
  Disposer *this_00;
  Node *object;
  Node *ptrCopy;
  Disposer *disposerCopy;
  Own<capnp::compiler::Compiler::Node> *other_local;
  Own<capnp::compiler::Compiler::Node> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (Node *)0x0;
  if (object != (Node *)0x0) {
    Disposer::dispose<capnp::compiler::Compiler::Node>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }